

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

void __thiscall
FIX::SessionState::get
          (SessionState *this,int b,int e,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *m)

{
  Mutex::lock(&this->m_mutex);
  (*this->m_pStore->_vptr_MessageStore[3])(this->m_pStore,(ulong)(uint)b,(ulong)(uint)e,m);
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void get( int b, int e, std::vector < std::string > &m ) const
  EXCEPT ( IOException )
  { Locker l( m_mutex ); m_pStore->get( b, e, m ); }